

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode parseurlandfillconn(Curl_easy *data,connectdata *conn)

{
  ushort uVar1;
  uint uVar2;
  CURLcode CVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  ulong ulnum;
  uint uVar8;
  urlreject uVar9;
  uint local_94;
  char *local_90;
  byte local_79;
  unsigned_long port;
  char *decoded_1;
  char *decoded;
  size_t hlen;
  char *newurl;
  char *url;
  char *pcStack_40;
  _Bool use_set_uh;
  char *hostname;
  CURLU *pCStack_30;
  CURLUcode uc;
  CURLU *uh;
  connectdata *pcStack_20;
  CURLcode result;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  local_79 = 0;
  if ((data->set).uh != (CURLU *)0x0) {
    local_79 = (*(uint *)&(data->state).field_0x6d0 >> 1 & 1) != 0 ^ 0xff;
  }
  url._7_1_ = local_79 & 1;
  pcStack_20 = conn;
  conn_local = (connectdata *)data;
  up_free(data);
  if ((url._7_1_ & 1) == 0) {
    pCStack_30 = curl_url();
    *(CURLU **)&conn_local[3].socks_proxy.proxytype = pCStack_30;
  }
  else {
    pCStack_30 = curl_url_dup((CURLU *)conn_local[1].proto.httpc.local_settings[0]);
    *(CURLU **)&conn_local[3].socks_proxy.proxytype = pCStack_30;
  }
  if (pCStack_30 == (CURLU *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  if ((*(long *)conn_local[1].sock != 0) &&
     (sVar5 = Curl_is_absolute_url(conn_local[3].http_proxy.passwd,(char *)0x0,0,true), sVar5 == 0))
  {
    newurl = curl_maprintf("%s://%s",*(undefined8 *)conn_local[1].sock,
                           conn_local[3].http_proxy.passwd);
    if (newurl == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    if ((*(uint *)&conn_local[3].proxy_ssl[1].backend >> 0x11 & 1) != 0) {
      (*Curl_cfree)(conn_local[3].http_proxy.passwd);
    }
    conn_local[3].http_proxy.passwd = newurl;
    *(uint *)&conn_local[3].proxy_ssl[1].backend =
         *(uint *)&conn_local[3].proxy_ssl[1].backend & 0xfffdffff | 0x20000;
  }
  if ((url._7_1_ & 1) == 0) {
    uVar8 = 0;
    if ((*(ulong *)((long)&conn_local[1].proto.httpc.local_settings_num + 2) & 0x1000000000000) != 0
       ) {
      uVar8 = 0x20;
    }
    uVar2 = 0;
    if (((uint)((ulong)*(undefined8 *)((long)&conn_local[1].proto.httpc.local_settings_num + 2) >>
               0x29) & 1) != 0) {
      uVar2 = 0x10;
    }
    hostname._4_4_ =
         curl_url_set(pCStack_30,CURLUPART_URL,conn_local[3].http_proxy.passwd,uVar8 | 0x208 | uVar2
                     );
    if (hostname._4_4_ != CURLUE_OK) {
      CVar3 = Curl_uc_to_curlcode(hostname._4_4_);
      return CVar3;
    }
    hostname._4_4_ = curl_url_get(pCStack_30,CURLUPART_URL,(char **)&hlen,0);
    if (hostname._4_4_ != CURLUE_OK) {
      CVar3 = Curl_uc_to_curlcode(hostname._4_4_);
      return CVar3;
    }
    if ((*(uint *)&conn_local[3].proxy_ssl[1].backend >> 0x11 & 1) != 0) {
      (*Curl_cfree)(conn_local[3].http_proxy.passwd);
    }
    conn_local[3].http_proxy.passwd = (char *)hlen;
    *(uint *)&conn_local[3].proxy_ssl[1].backend =
         *(uint *)&conn_local[3].proxy_ssl[1].backend & 0xfffdffff | 0x20000;
  }
  hostname._4_4_ = curl_url_get(pCStack_30,CURLUPART_SCHEME,&conn_local[3].socks_proxy.user,0);
  if (hostname._4_4_ == CURLUE_OK) {
    hostname._4_4_ = curl_url_get(pCStack_30,CURLUPART_HOST,&conn_local[3].socks_proxy.passwd,0);
    if (hostname._4_4_ == CURLUE_OK) {
      sVar6 = strlen(conn_local[3].socks_proxy.passwd);
      if (0xffff < sVar6) {
        Curl_failf((Curl_easy *)conn_local,"Too long host name (maximum is %d)",0xffff);
        return CURLE_URL_MALFORMAT;
      }
    }
    else {
      iVar4 = Curl_strcasecompare("file",conn_local[3].socks_proxy.user);
      if (iVar4 == 0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    pcStack_40 = conn_local[3].socks_proxy.passwd;
    if ((pcStack_40 != (char *)0x0) && (*pcStack_40 == '[')) {
      *(uint *)&(pcStack_20->bits).field_0x4 =
           *(uint *)&(pcStack_20->bits).field_0x4 & 0xfffff7ff | 0x800;
      pcStack_40 = pcStack_40 + 1;
      decoded = (char *)strlen(pcStack_40);
      pcStack_40[(long)(decoded + -1)] = '\0';
      zonefrom_url(pCStack_30,(Curl_easy *)conn_local,pcStack_20);
    }
    if (pcStack_40 == (char *)0x0) {
      local_90 = "";
    }
    else {
      local_90 = pcStack_40;
    }
    pcVar7 = (*Curl_cstrdup)(local_90);
    (pcStack_20->host).rawalloc = pcVar7;
    if ((pcStack_20->host).rawalloc == (char *)0x0) {
      data_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      (pcStack_20->host).name = (pcStack_20->host).rawalloc;
      uh._4_4_ = Curl_idnconvert_hostname((Curl_easy *)conn_local,&pcStack_20->host);
      data_local._4_4_ = uh._4_4_;
      if ((((uh._4_4_ == CURLE_OK) &&
           (((*(uint *)&(pcStack_20->bits).field_0x4 >> 9 & 1) == 0 ||
            (data_local._4_4_ =
                  Curl_idnconvert_hostname((Curl_easy *)conn_local,&pcStack_20->conn_to_host),
            data_local._4_4_ == CURLE_OK)))) &&
          ((uh._4_4_ = 0, (*(uint *)&(pcStack_20->bits).field_0x4 & 1) == 0 ||
           (data_local._4_4_ =
                 Curl_idnconvert_hostname((Curl_easy *)conn_local,&(pcStack_20->http_proxy).host),
           data_local._4_4_ == CURLE_OK)))) &&
         ((uh._4_4_ = 0, (*(uint *)&(pcStack_20->bits).field_0x4 >> 1 & 1) == 0 ||
          (data_local._4_4_ =
                Curl_idnconvert_hostname((Curl_easy *)conn_local,&(pcStack_20->socks_proxy).host),
          data_local._4_4_ == CURLE_OK)))) {
        uh._4_4_ = 0;
        uh._4_4_ = findprotocol((Curl_easy *)conn_local,pcStack_20,conn_local[3].socks_proxy.user);
        data_local._4_4_ = uh._4_4_;
        if (uh._4_4_ == CURLE_OK) {
          if (conn_local[3].proxy_ssl[0].backend == (ssl_backend_data *)0x0) {
            hostname._4_4_ =
                 curl_url_get(pCStack_30,CURLUPART_PASSWORD,&conn_local[3].http_proxy.host.name,0);
            if (hostname._4_4_ == CURLUE_OK) {
              uVar9 = REJECT_CTRL;
              if ((pcStack_20->handler->flags & 0x2000) != 0) {
                uVar9 = REJECT_ZERO;
              }
              uh._4_4_ = Curl_urldecode(conn_local[3].http_proxy.host.name,0,&decoded_1,
                                        (size_t *)0x0,uVar9);
              if (uh._4_4_ != CURLE_OK) {
                return uh._4_4_;
              }
              pcStack_20->passwd = decoded_1;
              uh._4_4_ = Curl_setstropt((char **)&conn_local[3].proxy_ssl[0].backend,decoded_1);
              if (uh._4_4_ != CURLE_OK) {
                return uh._4_4_;
              }
            }
            else if (hostname._4_4_ != CURLUE_NO_PASSWORD) {
              CVar3 = Curl_uc_to_curlcode(hostname._4_4_);
              return CVar3;
            }
          }
          if (conn_local[1].proxy_ssl_config.version == 0) {
            hostname._4_4_ =
                 curl_url_get(pCStack_30,CURLUPART_USER,&conn_local[3].http_proxy.host.encalloc,0);
            if (hostname._4_4_ == CURLUE_OK) {
              uVar9 = REJECT_CTRL;
              if ((pcStack_20->handler->flags & 0x2000) != 0) {
                uVar9 = REJECT_ZERO;
              }
              uh._4_4_ = Curl_urldecode(conn_local[3].http_proxy.host.encalloc,0,(char **)&port,
                                        (size_t *)0x0,uVar9);
              if (uh._4_4_ != CURLE_OK) {
                return uh._4_4_;
              }
              pcStack_20->user = (char *)port;
              uh._4_4_ = Curl_setstropt((char **)conn_local[3].proxy_ssl,(char *)port);
            }
            else {
              if (hostname._4_4_ != CURLUE_NO_USER) {
                CVar3 = Curl_uc_to_curlcode(hostname._4_4_);
                return CVar3;
              }
              if (conn_local[3].proxy_ssl[0].backend != (ssl_backend_data *)0x0) {
                uh._4_4_ = Curl_setstropt((char **)conn_local[3].proxy_ssl,"");
              }
            }
            if (uh._4_4_ != CURLE_OK) {
              return uh._4_4_;
            }
          }
          hostname._4_4_ =
               curl_url_get(pCStack_30,CURLUPART_OPTIONS,&conn_local[3].http_proxy.host.dispname,
                            0x40);
          if (hostname._4_4_ == CURLUE_OK) {
            pcVar7 = (*Curl_cstrdup)(conn_local[3].http_proxy.host.dispname);
            pcStack_20->options = pcVar7;
            if (pcStack_20->options == (char *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
          }
          else if (hostname._4_4_ != CURLUE_NO_OPTIONS) {
            CVar3 = Curl_uc_to_curlcode(hostname._4_4_);
            return CVar3;
          }
          hostname._4_4_ =
               curl_url_get(pCStack_30,CURLUPART_PATH,(char **)&conn_local[3].http_proxy.port,0x80);
          if (hostname._4_4_ == CURLUE_OK) {
            hostname._4_4_ =
                 curl_url_get(pCStack_30,CURLUPART_PORT,(char **)&conn_local[3].http_proxy,1);
            if (hostname._4_4_ == CURLUE_OK) {
              ulnum = strtoul(conn_local[3].http_proxy.host.rawalloc,(char **)0x0,10);
              if (((short)conn_local->tempsock[0] == 0) ||
                 ((*(uint *)&conn_local[3].proxy_ssl[1].backend >> 4 & 1) == 0)) {
                uVar1 = curlx_ultous(ulnum);
              }
              else {
                uVar1 = (ushort)conn_local->tempsock[0];
              }
              local_94 = (uint)uVar1;
              pcStack_20->remote_port = local_94;
              pcStack_20->port = local_94;
            }
            else {
              iVar4 = Curl_strcasecompare("file",conn_local[3].socks_proxy.user);
              if (iVar4 == 0) {
                return CURLE_OUT_OF_MEMORY;
              }
            }
            curl_url_get(pCStack_30,CURLUPART_QUERY,(char **)&conn_local[3].http_proxy.proxytype,0);
            if (*(int *)((long)&conn_local[1].proto + 0x18) != 0) {
              pcStack_20->scope_id = *(uint *)((long)&conn_local[1].proto + 0x18);
            }
            data_local._4_4_ = CURLE_OK;
          }
          else {
            data_local._4_4_ = Curl_uc_to_curlcode(hostname._4_4_);
          }
        }
      }
    }
  }
  else {
    data_local._4_4_ = Curl_uc_to_curlcode(hostname._4_4_);
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode parseurlandfillconn(struct Curl_easy *data,
                                    struct connectdata *conn)
{
  CURLcode result;
  CURLU *uh;
  CURLUcode uc;
  char *hostname;
  bool use_set_uh = (data->set.uh && !data->state.this_is_a_follow);

  up_free(data); /* cleanup previous leftovers first */

  /* parse the URL */
  if(use_set_uh) {
    uh = data->state.uh = curl_url_dup(data->set.uh);
  }
  else {
    uh = data->state.uh = curl_url();
  }

  if(!uh)
    return CURLE_OUT_OF_MEMORY;

  if(data->set.str[STRING_DEFAULT_PROTOCOL] &&
     !Curl_is_absolute_url(data->state.url, NULL, 0, TRUE)) {
    char *url = aprintf("%s://%s", data->set.str[STRING_DEFAULT_PROTOCOL],
                        data->state.url);
    if(!url)
      return CURLE_OUT_OF_MEMORY;
    if(data->state.url_alloc)
      free(data->state.url);
    data->state.url = url;
    data->state.url_alloc = TRUE;
  }

  if(!use_set_uh) {
    char *newurl;
    uc = curl_url_set(uh, CURLUPART_URL, data->state.url,
                    CURLU_GUESS_SCHEME |
                    CURLU_NON_SUPPORT_SCHEME |
                    (data->set.disallow_username_in_url ?
                     CURLU_DISALLOW_USER : 0) |
                    (data->set.path_as_is ? CURLU_PATH_AS_IS : 0));
    if(uc) {
      DEBUGF(infof(data, "curl_url_set rejected %s: %s", data->state.url,
                   curl_url_strerror(uc)));
      return Curl_uc_to_curlcode(uc);
    }

    /* after it was parsed, get the generated normalized version */
    uc = curl_url_get(uh, CURLUPART_URL, &newurl, 0);
    if(uc)
      return Curl_uc_to_curlcode(uc);
    if(data->state.url_alloc)
      free(data->state.url);
    data->state.url = newurl;
    data->state.url_alloc = TRUE;
  }

  uc = curl_url_get(uh, CURLUPART_SCHEME, &data->state.up.scheme, 0);
  if(uc)
    return Curl_uc_to_curlcode(uc);

  uc = curl_url_get(uh, CURLUPART_HOST, &data->state.up.hostname, 0);
  if(uc) {
    if(!strcasecompare("file", data->state.up.scheme))
      return CURLE_OUT_OF_MEMORY;
  }
  else if(strlen(data->state.up.hostname) > MAX_URL_LEN) {
    failf(data, "Too long host name (maximum is %d)", MAX_URL_LEN);
    return CURLE_URL_MALFORMAT;
  }
  hostname = data->state.up.hostname;

  if(hostname && hostname[0] == '[') {
    /* This looks like an IPv6 address literal. See if there is an address
       scope. */
    size_t hlen;
    conn->bits.ipv6_ip = TRUE;
    /* cut off the brackets! */
    hostname++;
    hlen = strlen(hostname);
    hostname[hlen - 1] = 0;

    zonefrom_url(uh, data, conn);
  }

  /* make sure the connect struct gets its own copy of the host name */
  conn->host.rawalloc = strdup(hostname ? hostname : "");
  if(!conn->host.rawalloc)
    return CURLE_OUT_OF_MEMORY;
  conn->host.name = conn->host.rawalloc;

  /*************************************************************
   * IDN-convert the hostnames
   *************************************************************/
  result = Curl_idnconvert_hostname(data, &conn->host);
  if(result)
    return result;
  if(conn->bits.conn_to_host) {
    result = Curl_idnconvert_hostname(data, &conn->conn_to_host);
    if(result)
      return result;
  }
#ifndef CURL_DISABLE_PROXY
  if(conn->bits.httpproxy) {
    result = Curl_idnconvert_hostname(data, &conn->http_proxy.host);
    if(result)
      return result;
  }
  if(conn->bits.socksproxy) {
    result = Curl_idnconvert_hostname(data, &conn->socks_proxy.host);
    if(result)
      return result;
  }
#endif

#ifndef CURL_DISABLE_HSTS
  /* HSTS upgrade */
  if(data->hsts && strcasecompare("http", data->state.up.scheme)) {
    /* This MUST use the IDN decoded name */
    if(Curl_hsts(data->hsts, conn->host.name, TRUE)) {
      char *url;
      Curl_safefree(data->state.up.scheme);
      uc = curl_url_set(uh, CURLUPART_SCHEME, "https", 0);
      if(uc)
        return Curl_uc_to_curlcode(uc);
      if(data->state.url_alloc)
        Curl_safefree(data->state.url);
      /* after update, get the updated version */
      uc = curl_url_get(uh, CURLUPART_URL, &url, 0);
      if(uc)
        return Curl_uc_to_curlcode(uc);
      uc = curl_url_get(uh, CURLUPART_SCHEME, &data->state.up.scheme, 0);
      if(uc) {
        free(url);
        return Curl_uc_to_curlcode(uc);
      }
      data->state.url = url;
      data->state.url_alloc = TRUE;
      infof(data, "Switched from HTTP to HTTPS due to HSTS => %s",
            data->state.url);
    }
  }
#endif

  result = findprotocol(data, conn, data->state.up.scheme);
  if(result)
    return result;

  /*
   * User name and password set with their own options override the
   * credentials possibly set in the URL.
   */
  if(!data->state.aptr.passwd) {
    uc = curl_url_get(uh, CURLUPART_PASSWORD, &data->state.up.password, 0);
    if(!uc) {
      char *decoded;
      result = Curl_urldecode(data->state.up.password, 0, &decoded, NULL,
                              conn->handler->flags&PROTOPT_USERPWDCTRL ?
                              REJECT_ZERO : REJECT_CTRL);
      if(result)
        return result;
      conn->passwd = decoded;
      result = Curl_setstropt(&data->state.aptr.passwd, decoded);
      if(result)
        return result;
    }
    else if(uc != CURLUE_NO_PASSWORD)
      return Curl_uc_to_curlcode(uc);
  }

  if(!data->set.str[STRING_USERNAME]) {
    /* we don't use the URL API's URL decoder option here since it rejects
       control codes and we want to allow them for some schemes in the user
       and password fields */
    uc = curl_url_get(uh, CURLUPART_USER, &data->state.up.user, 0);
    if(!uc) {
      char *decoded;
      result = Curl_urldecode(data->state.up.user, 0, &decoded, NULL,
                              conn->handler->flags&PROTOPT_USERPWDCTRL ?
                              REJECT_ZERO : REJECT_CTRL);
      if(result)
        return result;
      conn->user = decoded;
      result = Curl_setstropt(&data->state.aptr.user, decoded);
    }
    else if(uc != CURLUE_NO_USER)
      return Curl_uc_to_curlcode(uc);
    else if(data->state.aptr.passwd) {
      /* no user was set but a password, set a blank user */
      result = Curl_setstropt(&data->state.aptr.user, "");
    }
    if(result)
      return result;
  }

  uc = curl_url_get(uh, CURLUPART_OPTIONS, &data->state.up.options,
                    CURLU_URLDECODE);
  if(!uc) {
    conn->options = strdup(data->state.up.options);
    if(!conn->options)
      return CURLE_OUT_OF_MEMORY;
  }
  else if(uc != CURLUE_NO_OPTIONS)
    return Curl_uc_to_curlcode(uc);

  uc = curl_url_get(uh, CURLUPART_PATH, &data->state.up.path,
                    CURLU_URLENCODE);
  if(uc)
    return Curl_uc_to_curlcode(uc);

  uc = curl_url_get(uh, CURLUPART_PORT, &data->state.up.port,
                    CURLU_DEFAULT_PORT);
  if(uc) {
    if(!strcasecompare("file", data->state.up.scheme))
      return CURLE_OUT_OF_MEMORY;
  }
  else {
    unsigned long port = strtoul(data->state.up.port, NULL, 10);
    conn->port = conn->remote_port =
      (data->set.use_port && data->state.allow_port) ?
      data->set.use_port : curlx_ultous(port);
  }

  (void)curl_url_get(uh, CURLUPART_QUERY, &data->state.up.query, 0);

#ifdef ENABLE_IPV6
  if(data->set.scope_id)
    /* Override any scope that was set above.  */
    conn->scope_id = data->set.scope_id;
#endif

  return CURLE_OK;
}